

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

bool flatbuffers::anon_unknown_96::VerifyVector
               (Verifier *v,Schema *schema,Table *table,Field *vec_field)

{
  bool bVar1;
  return_type utype_00;
  uint16_t uVar2;
  BaseType BVar3;
  uint uVar4;
  Type *pTVar5;
  Vector<signed_char,_unsigned_int> *vec_00;
  Vector<short,_unsigned_int> *vec_01;
  Vector<int,_unsigned_int> *vec_02;
  Vector<long,_unsigned_int> *vec_03;
  Vector<float,_unsigned_int> *vec_04;
  Vector<double,_unsigned_int> *vec_05;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *vec_06;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *this;
  char *pcVar6;
  return_type this_00;
  Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int> *vec_07;
  return_type table_00;
  Vector<flatbuffers::Offset<unsigned_char>,_unsigned_int> *vec_08;
  Vector<unsigned_char,_unsigned_int> *pVVar7;
  return_type elem_00;
  int __c;
  Verifier *__s;
  return_type elem;
  return_type utype;
  uoffset_t j_1;
  Vector<unsigned_char,_unsigned_int> *type_vec;
  Vector<flatbuffers::Offset<unsigned_char>,_unsigned_int> *vec_1;
  uoffset_t j;
  Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int> *vec;
  return_type obj;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *vec_string;
  Field *vec_field_local;
  Table *table_local;
  Schema *schema_local;
  Verifier *v_local;
  
  pTVar5 = reflection::Field::type(vec_field);
  BVar3 = reflection::Type::base_type(pTVar5);
  if (BVar3 != Vector) {
    __assert_fail("vec_field.type()->base_type() == reflection::Vector",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/reflection.cpp"
                  ,0x5e,
                  "bool flatbuffers::(anonymous namespace)::VerifyVector(flatbuffers::Verifier &, const reflection::Schema &, const flatbuffers::Table &, const reflection::Field &)"
                 );
  }
  uVar2 = reflection::Field::offset(vec_field);
  __s = v;
  bVar1 = Table::VerifyField<unsigned_int>(table,v,uVar2,4);
  if (bVar1) {
    pTVar5 = reflection::Field::type(vec_field);
    BVar3 = reflection::Type::element(pTVar5);
    switch(BVar3) {
    case None:
    case Vector:
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/reflection.cpp"
                    ,0xa5,
                    "bool flatbuffers::(anonymous namespace)::VerifyVector(flatbuffers::Verifier &, const reflection::Schema &, const flatbuffers::Table &, const reflection::Field &)"
                   );
    case UType:
      pVVar7 = GetFieldV<unsigned_char>(table,vec_field);
      v_local._7_1_ = VerifierTemplate<false>::VerifyVector<unsigned_char,_unsigned_int>(v,pVVar7);
      break;
    case Bool:
    case Byte:
    case UByte:
      vec_00 = GetFieldV<signed_char>(table,vec_field);
      v_local._7_1_ = VerifierTemplate<false>::VerifyVector<signed_char,_unsigned_int>(v,vec_00);
      break;
    case Short:
    case UShort:
      vec_01 = GetFieldV<short>(table,vec_field);
      v_local._7_1_ = VerifierTemplate<false>::VerifyVector<short,_unsigned_int>(v,vec_01);
      break;
    case Int:
    case UInt:
      vec_02 = GetFieldV<int>(table,vec_field);
      v_local._7_1_ = VerifierTemplate<false>::VerifyVector<int,_unsigned_int>(v,vec_02);
      break;
    case Long:
    case ULong:
      vec_03 = GetFieldV<long>(table,vec_field);
      v_local._7_1_ = VerifierTemplate<false>::VerifyVector<long,_unsigned_int>(v,vec_03);
      break;
    case Float:
      vec_04 = GetFieldV<float>(table,vec_field);
      v_local._7_1_ = VerifierTemplate<false>::VerifyVector<float,_unsigned_int>(v,vec_04);
      break;
    case Double:
      vec_05 = GetFieldV<double>(table,vec_field);
      v_local._7_1_ = VerifierTemplate<false>::VerifyVector<double,_unsigned_int>(v,vec_05);
      break;
    case String:
      vec_06 = GetFieldV<flatbuffers::Offset<flatbuffers::String>>(table,vec_field);
      bVar1 = VerifierTemplate<false>::
              VerifyVector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>(v,vec_06);
      if ((bVar1) && (bVar1 = VerifierTemplate<false>::VerifyVectorOfStrings(v,vec_06), bVar1)) {
        v_local._7_1_ = true;
      }
      else {
        v_local._7_1_ = false;
      }
      break;
    case Obj:
      this = reflection::Schema::objects(schema);
      pTVar5 = reflection::Field::type(vec_field);
      pcVar6 = reflection::Type::index(pTVar5,(char *)__s,__c);
      this_00 = Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get
                          (this,(uint)pcVar6);
      bVar1 = reflection::Object::is_struct(this_00);
      if (bVar1) {
        uVar2 = reflection::Field::offset(vec_field);
        bVar1 = reflection::Field::required(vec_field);
        v_local._7_1_ = VerifyVectorOfStructs(v,table,uVar2,this_00,bVar1);
      }
      else {
        vec_07 = GetFieldV<flatbuffers::Offset<flatbuffers::Table>>(table,vec_field);
        bVar1 = VerifierTemplate<false>::
                VerifyVector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int>(v,vec_07);
        if (bVar1) {
          if (vec_07 == (Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int> *)0x0) {
            v_local._7_1_ = true;
          }
          else {
            for (vec_1._4_4_ = 0;
                uVar4 = Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int>::size(vec_07),
                vec_1._4_4_ < uVar4; vec_1._4_4_ = vec_1._4_4_ + 1) {
              table_00 = Vector<flatbuffers::Offset<flatbuffers::Table>,_unsigned_int>::Get
                                   (vec_07,vec_1._4_4_);
              bVar1 = VerifyObject(v,schema,this_00,table_00,true);
              if (!bVar1) {
                return false;
              }
            }
            v_local._7_1_ = true;
          }
        }
        else {
          v_local._7_1_ = false;
        }
      }
      break;
    case Union:
      vec_08 = GetFieldV<flatbuffers::Offset<unsigned_char>>(table,vec_field);
      bVar1 = VerifierTemplate<false>::
              VerifyVector<flatbuffers::Offset<unsigned_char>,_unsigned_int>(v,vec_08);
      if (bVar1) {
        if (vec_08 == (Vector<flatbuffers::Offset<unsigned_char>,_unsigned_int> *)0x0) {
          v_local._7_1_ = true;
        }
        else {
          uVar2 = reflection::Field::offset(vec_field);
          pVVar7 = Table::GetPointer<flatbuffers::Vector<unsigned_char,unsigned_int>*,unsigned_int>
                             (table,uVar2 - 2);
          bVar1 = VerifierTemplate<false>::VerifyVector<unsigned_char,_unsigned_int>(v,pVVar7);
          if (bVar1) {
            for (elem._4_4_ = 0;
                uVar4 = Vector<flatbuffers::Offset<unsigned_char>,_unsigned_int>::size(vec_08),
                elem._4_4_ < uVar4; elem._4_4_ = elem._4_4_ + 1) {
              utype_00 = Vector<unsigned_char,_unsigned_int>::Get(pVVar7,elem._4_4_);
              elem_00 = Vector<flatbuffers::Offset<unsigned_char>,_unsigned_int>::Get
                                  (vec_08,elem._4_4_);
              bVar1 = VerifyUnion(v,schema,utype_00,elem_00,vec_field);
              if (!bVar1) {
                return false;
              }
            }
            v_local._7_1_ = true;
          }
          else {
            v_local._7_1_ = false;
          }
        }
      }
      else {
        v_local._7_1_ = false;
      }
    }
  }
  else {
    v_local._7_1_ = false;
  }
  return v_local._7_1_;
}

Assistant:

static bool VerifyVector(flatbuffers::Verifier &v,
                         const reflection::Schema &schema,
                         const flatbuffers::Table &table,
                         const reflection::Field &vec_field) {
  FLATBUFFERS_ASSERT(vec_field.type()->base_type() == reflection::Vector);
  if (!table.VerifyField<uoffset_t>(v, vec_field.offset(), sizeof(uoffset_t)))
    return false;

  switch (vec_field.type()->element()) {
    case reflection::UType:
      return v.VerifyVector(flatbuffers::GetFieldV<uint8_t>(table, vec_field));
    case reflection::Bool:
    case reflection::Byte:
    case reflection::UByte:
      return v.VerifyVector(flatbuffers::GetFieldV<int8_t>(table, vec_field));
    case reflection::Short:
    case reflection::UShort:
      return v.VerifyVector(flatbuffers::GetFieldV<int16_t>(table, vec_field));
    case reflection::Int:
    case reflection::UInt:
      return v.VerifyVector(flatbuffers::GetFieldV<int32_t>(table, vec_field));
    case reflection::Long:
    case reflection::ULong:
      return v.VerifyVector(flatbuffers::GetFieldV<int64_t>(table, vec_field));
    case reflection::Float:
      return v.VerifyVector(flatbuffers::GetFieldV<float>(table, vec_field));
    case reflection::Double:
      return v.VerifyVector(flatbuffers::GetFieldV<double>(table, vec_field));
    case reflection::String: {
      auto vec_string =
          flatbuffers::GetFieldV<flatbuffers::Offset<flatbuffers::String>>(
              table, vec_field);
      if (v.VerifyVector(vec_string) && v.VerifyVectorOfStrings(vec_string)) {
        return true;
      } else {
        return false;
      }
    }
    case reflection::Obj: {
      auto obj = schema.objects()->Get(vec_field.type()->index());
      if (obj->is_struct()) {
        return VerifyVectorOfStructs(v, table, vec_field.offset(), *obj,
                                     vec_field.required());
      } else {
        auto vec =
            flatbuffers::GetFieldV<flatbuffers::Offset<flatbuffers::Table>>(
                table, vec_field);
        if (!v.VerifyVector(vec)) return false;
        if (!vec) return true;
        for (uoffset_t j = 0; j < vec->size(); j++) {
          if (!VerifyObject(v, schema, *obj, vec->Get(j), true)) {
            return false;
          }
        }
        return true;
      }
    }
    case reflection::Union: {
      auto vec = flatbuffers::GetFieldV<flatbuffers::Offset<uint8_t>>(
          table, vec_field);
      if (!v.VerifyVector(vec)) return false;
      if (!vec) return true;
      auto type_vec = table.GetPointer<Vector<uint8_t> *>(vec_field.offset() -
                                                          sizeof(voffset_t));
      if (!v.VerifyVector(type_vec)) return false;
      for (uoffset_t j = 0; j < vec->size(); j++) {
        //  get union type from the prev field
        auto utype = type_vec->Get(j);
        auto elem = vec->Get(j);
        if (!VerifyUnion(v, schema, utype, elem, vec_field)) return false;
      }
      return true;
    }
    case reflection::Vector:
    case reflection::None:
    default: FLATBUFFERS_ASSERT(false); return false;
  }
}